

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O0

void __thiscall
passthrough_resampler<float>::drop_audio_if_needed(passthrough_resampler<float> *this)

{
  uint32_t uVar1;
  size_t sVar2;
  float *in_RDI;
  uint32_t available;
  uint32_t to_keep;
  float *length;
  auto_array<float> *this_00;
  
  uVar1 = min_buffered_audio_frame((uint32_t)in_RDI[0x10]);
  this_00 = (auto_array<float> *)(in_RDI + 2);
  sVar2 = auto_array<float>::length((auto_array<float> *)(in_RDI + 10));
  sVar2 = processor::samples_to_frames((processor *)this_00,sVar2);
  if (uVar1 < (uint)sVar2) {
    length = in_RDI + 10;
    processor::frames_to_samples((processor *)(in_RDI + 2),(ulong)((uint)sVar2 - uVar1));
    auto_array<float>::pop(this_00,in_RDI,(size_t)length);
  }
  return;
}

Assistant:

void drop_audio_if_needed()
  {
    uint32_t to_keep = min_buffered_audio_frame(sample_rate);
    uint32_t available = samples_to_frames(internal_input_buffer.length());
    if (available > to_keep) {
      internal_input_buffer.pop(nullptr,
                                frames_to_samples(available - to_keep));
    }
  }